

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

HighsStatus __thiscall Highs::scaleColInterface(Highs *this,HighsInt col,double scale_value)

{
  HighsStatus HVar1;
  HighsStatus HVar2;
  reference pvVar3;
  reference pvVar4;
  int in_ESI;
  long in_RDI;
  double in_XMM0_Qa;
  SimplexBasis *simplex_basis;
  HighsSimplexStatus *simplex_status;
  HighsBasis *basis;
  HighsLp *lp;
  HighsStatus return_status;
  HighsLogOptions *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  HighsStatus HVar5;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 uVar6;
  allocator *paVar7;
  LpAction action;
  undefined4 in_stack_ffffffffffffff10;
  double in_stack_ffffffffffffff28;
  string local_d0 [4];
  HighsInt in_stack_ffffffffffffff34;
  HighsLp *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  HighsStatus in_stack_ffffffffffffff48;
  HighsStatus in_stack_ffffffffffffff4c;
  HighsLogOptions *in_stack_ffffffffffffff50;
  HighsStatus local_4;
  
  HighsLp::ensureColwise((HighsLp *)0x4dcf89);
  if (in_ESI < 0) {
    local_4 = kError;
  }
  else if (in_ESI < *(int *)(in_RDI + 0x138)) {
    if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
      HighsLogOptions::HighsLogOptions
                ((HighsLogOptions *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffef8);
      HVar1 = applyScalingToLpCol(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                                  in_stack_ffffffffffffff28);
      uVar6 = 0;
      paVar7 = (allocator *)&stack0xffffffffffffff2f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,"applyScalingToLpCol",paVar7);
      action = (LpAction)((ulong)paVar7 >> 0x20);
      HVar2 = interpretCallStatus(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                                  in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      HVar5 = HVar2;
      std::__cxx11::string::~string(local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
      HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x4dd09b);
      if (HVar2 == kError) {
        local_4 = kError;
      }
      else {
        if ((in_XMM0_Qa < 0.0) && ((*(byte *)(in_RDI + 0x70) & 1) != 0)) {
          pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                             ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                              (in_RDI + 0xa0),(long)in_ESI);
          if (*pvVar3 == kLower) {
            pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                               ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                                (in_RDI + 0xa0),(long)in_ESI);
            *pvVar3 = kUpper;
          }
          else {
            pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                               ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                                (in_RDI + 0xa0),(long)in_ESI);
            if (*pvVar3 == kUpper) {
              pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                                 ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                                  (in_RDI + 0xa0),(long)in_ESI);
              *pvVar3 = kLower;
            }
          }
        }
        if ((((*(byte *)(in_RDI + 0x384b) & 1) != 0) && (in_XMM0_Qa < 0.0)) &&
           ((*(byte *)(in_RDI + 0x384c) & 1) != 0)) {
          pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                             ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x3ca0)
                              ,(long)in_ESI);
          if (*pvVar4 == '\x01') {
            pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                               ((vector<signed_char,_std::allocator<signed_char>_> *)
                                (in_RDI + 0x3ca0),(long)in_ESI);
            *pvVar4 = -1;
          }
          else {
            pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                               ((vector<signed_char,_std::allocator<signed_char>_> *)
                                (in_RDI + 0x3ca0),(long)in_ESI);
            if (*pvVar4 == -1) {
              pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                                 ((vector<signed_char,_std::allocator<signed_char>_> *)
                                  (in_RDI + 0x3ca0),(long)in_ESI);
              *pvVar4 = '\x01';
            }
          }
        }
        invalidateModelStatusSolutionAndInfo((Highs *)CONCAT44(uVar6,HVar5));
        HEkk::updateStatus((HEkk *)CONCAT44(HVar1,in_stack_ffffffffffffff10),action);
        local_4 = kOk;
      }
    }
    else {
      local_4 = kError;
    }
  }
  else {
    local_4 = kError;
  }
  return local_4;
}

Assistant:

HighsStatus Highs::scaleColInterface(const HighsInt col,
                                     const double scale_value) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsLp& lp = model_.lp_;
  HighsBasis& basis = basis_;
  HighsSimplexStatus& simplex_status = ekk_instance_.status_;

  // Ensure that the LP is column-wise
  lp.ensureColwise();
  if (col < 0) return HighsStatus::kError;
  if (col >= lp.num_col_) return HighsStatus::kError;
  if (!scale_value) return HighsStatus::kError;

  return_status = interpretCallStatus(options_.log_options,
                                      applyScalingToLpCol(lp, col, scale_value),
                                      return_status, "applyScalingToLpCol");
  if (return_status == HighsStatus::kError) return return_status;

  if (scale_value < 0 && basis.valid) {
    // Negative, so flip any nonbasic status
    if (basis.col_status[col] == HighsBasisStatus::kLower) {
      basis.col_status[col] = HighsBasisStatus::kUpper;
    } else if (basis.col_status[col] == HighsBasisStatus::kUpper) {
      basis.col_status[col] = HighsBasisStatus::kLower;
    }
  }
  if (simplex_status.initialised_for_solve) {
    SimplexBasis& simplex_basis = ekk_instance_.basis_;
    if (scale_value < 0 && simplex_status.has_basis) {
      // Negative, so flip any nonbasic status
      if (simplex_basis.nonbasicMove_[col] == kNonbasicMoveUp) {
        simplex_basis.nonbasicMove_[col] = kNonbasicMoveDn;
      } else if (simplex_basis.nonbasicMove_[col] == kNonbasicMoveDn) {
        simplex_basis.nonbasicMove_[col] = kNonbasicMoveUp;
      }
    }
  }
  // Deduce the consequences of a scaled column
  invalidateModelStatusSolutionAndInfo();

  // Determine any implications for simplex data
  ekk_instance_.updateStatus(LpAction::kScaledCol);
  return HighsStatus::kOk;
}